

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

StringRef __thiscall llvm::sys::path::stem(path *this,StringRef path,Style style)

{
  StringRef path_00;
  StringRef SVar1;
  undefined1 auVar2 [8];
  char *pcVar3;
  size_t sVar4;
  unsigned_long *puVar5;
  bool bVar6;
  bool bVar7;
  size_t pos;
  undefined1 local_188 [8];
  StringRef fname;
  Style style_local;
  StringRef path_local;
  char *local_158;
  unsigned_long local_120;
  size_t local_118;
  unsigned_long local_110;
  undefined1 *local_108;
  char *local_f0;
  size_t local_e8;
  char *local_e0;
  size_t local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  size_t local_b8;
  char *local_b0;
  size_t local_a8;
  char *local_a0;
  char *local_98;
  char **local_78;
  char *local_70;
  size_t local_68;
  size_t local_60;
  char *local_58;
  char *local_50;
  int local_44;
  char **local_40;
  char *local_38;
  size_t local_30;
  size_t local_28;
  char *local_20;
  char *local_18;
  int local_c;
  
  fname.Length._4_4_ = (Style)path.Length;
  path_00.Length = (size_t)path.Data;
  path_00.Data = (char *)this;
  _local_188 = filename(path_00,fname.Length._4_4_);
  sVar4 = StringRef::find_last_of((StringRef *)local_188,'.',0xffffffffffffffff);
  pcVar3 = fname.Data;
  auVar2 = local_188;
  if (sVar4 == 0xffffffffffffffff) {
    path_local.Length = (size_t)local_188;
    local_158 = fname.Data;
    goto LAB_001f26f0;
  }
  if (fname.Data == (char *)0x1) {
    local_b8 = strlen(".");
    local_a0 = (char *)auVar2;
    local_98 = pcVar3;
    local_b0 = ".";
    local_c0 = ".";
    local_70 = ".";
    local_78 = &local_a0;
    bVar6 = false;
    local_a8 = local_b8;
    local_68 = local_b8;
    if (local_b8 == 1) {
      local_50 = (char *)auVar2;
      local_58 = ".";
      local_60 = local_b8;
      local_44 = memcmp((void *)auVar2,".",1);
      bVar6 = local_44 == 0;
    }
    bVar7 = true;
    if (!bVar6) goto LAB_001f2433;
  }
  else {
LAB_001f2433:
    pcVar3 = fname.Data;
    bVar7 = false;
    if (fname.Data == (char *)0x2) {
      auVar2 = local_188;
      local_e8 = strlen("..");
      local_d0 = (char *)auVar2;
      local_c8 = pcVar3;
      local_e0 = "..";
      local_f0 = "..";
      local_38 = "..";
      local_40 = &local_d0;
      bVar7 = false;
      local_d8 = local_e8;
      local_30 = local_e8;
      if (local_e8 == 2) {
        local_18 = (char *)auVar2;
        local_20 = "..";
        local_28 = local_e8;
        local_c = memcmp((void *)auVar2,"..",2);
        bVar7 = local_c == 0;
      }
    }
  }
  if (bVar7) {
    path_local.Length = (size_t)local_188;
    local_158 = fname.Data;
  }
  else {
    local_108 = local_188;
    local_110 = 0;
    local_118 = sVar4;
    puVar5 = std::min<unsigned_long>(&local_110,(unsigned_long *)&fname);
    local_110 = *puVar5;
    path_local.Length = (long)local_188 + local_110;
    local_120 = (long)fname.Data - local_110;
    puVar5 = std::min<unsigned_long>(&local_118,&local_120);
    local_158 = (char *)*puVar5;
  }
LAB_001f26f0:
  SVar1.Length = (size_t)local_158;
  SVar1.Data = (char *)path_local.Length;
  return SVar1;
}

Assistant:

StringRef stem(StringRef path, Style style) {
  StringRef fname = filename(path, style);
  size_t pos = fname.find_last_of('.');
  if (pos == StringRef::npos)
    return fname;
  else
    if ((fname.size() == 1 && fname == ".") ||
        (fname.size() == 2 && fname == ".."))
      return fname;
    else
      return fname.substr(0, pos);
}